

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_script.cpp
# Opt level: O3

void __thiscall Script_GetScript_Test::~Script_GetScript_Test(Script_GetScript_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Script, GetScript) {
  ScriptBuilder builder;
  std::vector<uint8_t> bytes(255, 1);
  builder.AppendData(ByteData(bytes));
  Script script = builder.Build();

  Script script2 = script.GetScript();
  EXPECT_STREQ(script.GetHex().c_str(), script2.GetHex().c_str());
  EXPECT_STREQ(script.ToString().c_str(), script2.ToString().c_str());
}